

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesAttGroupInfo.cpp
# Opt level: O0

SchemaAttDef * __thiscall
xercesc_4_0::XercesAttGroupInfo::getAttDef(XercesAttGroupInfo *this,XMLCh *baseName,int uriId)

{
  bool bVar1;
  uint uVar2;
  SchemaAttDef *pSVar3;
  SchemaAttDef *this_00;
  QName *this_01;
  XMLCh *str2;
  QName *attName;
  SchemaAttDef *attDef;
  XMLSize_t i;
  XMLSize_t attSize;
  int uriId_local;
  XMLCh *baseName_local;
  XercesAttGroupInfo *this_local;
  
  if (this->fAttributes != (RefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
    pSVar3 = (SchemaAttDef *)
             BaseRefVectorOf<xercesc_4_0::SchemaAttDef>::size
                       (&this->fAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>);
    for (attDef = (SchemaAttDef *)0x0; attDef < pSVar3;
        attDef = (SchemaAttDef *)
                 ((long)&(attDef->super_XMLAttDef).super_XSerializable._vptr_XSerializable + 1)) {
      this_00 = BaseRefVectorOf<xercesc_4_0::SchemaAttDef>::elementAt
                          (&this->fAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>,
                           (XMLSize_t)attDef);
      this_01 = SchemaAttDef::getAttName(this_00);
      uVar2 = QName::getURI(this_01);
      if (uriId == uVar2) {
        str2 = QName::getLocalPart(this_01);
        bVar1 = XMLString::equals(baseName,str2);
        if (bVar1) {
          return this_00;
        }
      }
    }
  }
  return (SchemaAttDef *)0x0;
}

Assistant:

const SchemaAttDef* XercesAttGroupInfo::getAttDef(const XMLCh* const baseName,
                                                  const int uriId) const {

    // If no list, then return a null
    if (!fAttributes)
        return 0;

    XMLSize_t attSize = fAttributes->size();

    for (XMLSize_t i=0; i<attSize; i++) {

        const SchemaAttDef* attDef = fAttributes->elementAt(i);
        QName* attName = attDef->getAttName();

        if (uriId == (int) attName->getURI() &&
			XMLString::equals(baseName, attName->getLocalPart())) {

            return attDef;
        }
    }

    return 0;
}